

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

int exr_set_data_window(exr_context_t ctxt,int part_index,exr_attr_box2i_t *dw)

{
  pthread_mutex_t *__mutex;
  exr_attribute_t **attr;
  exr_priv_part_t curpart;
  exr_attr_box2i_t *peVar1;
  exr_attr_v2i_t eVar2;
  exr_result_t eVar3;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  exr_attribute_t *peVar4;
  exr_context_t nonc;
  
  if (dw == (exr_attr_box2i_t *)0x0) {
    eVar3 = (*ctxt->report_error)(ctxt,3,"Missing value for data window assignment");
    return eVar3;
  }
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar3 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar3;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar3 = 0x15;
LAB_0011b9c4:
    eVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar3);
    return eVar3;
  }
  if (ctxt->mode == '\0') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar3 = 8;
    goto LAB_0011b9c4;
  }
  curpart = ctxt->parts[(uint)part_index];
  attr = &curpart->dataWindow;
  peVar4 = curpart->dataWindow;
  if (peVar4 == (exr_attribute_t *)0x0) {
    eVar3 = exr_attr_list_add(ctxt,&curpart->attributes,"dataWindow",EXR_ATTR_BOX2I,0,
                              (uint8_t **)0x0,attr);
    if (eVar3 != 0) goto LAB_0011ba8a;
    peVar4 = *attr;
  }
  else if (peVar4->type != EXR_ATTR_BOX2I) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar3 = (*ctxt->print_error)
                      (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",(*attr)->type_name
                       ,"dataWindow",ctxt->print_error);
    return eVar3;
  }
  peVar1 = (peVar4->field_6).box2i;
  eVar2 = dw->max;
  peVar1->min = dw->min;
  peVar1->max = eVar2;
  eVar2 = dw->max;
  (curpart->data_window).min = dw->min;
  (curpart->data_window).max = eVar2;
  eVar3 = internal_exr_compute_tile_information(ctxt,curpart,1);
LAB_0011ba8a:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return eVar3;
}

Assistant:

exr_result_t
exr_set_data_window (
    exr_context_t ctxt, int part_index, const exr_attr_box2i_t* dw)
{
    if (!dw)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Missing value for data window assignment");

    {
        REQ_ATTR_FIND_CREATE (dataWindow, EXR_ATTR_BOX2I);

        if (rv == EXR_ERR_SUCCESS)
        {
            *(attr->box2i)    = *dw;
            part->data_window = *dw;

            rv = internal_exr_compute_tile_information (ctxt, part, 1);
        }

        return EXR_UNLOCK_AND_RETURN (rv);
    }
}